

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<Function*>,long_long>
               (reverse_iterator<Function_*> first,longlong n,reverse_iterator<Function_*> d_first)

{
  Function *pFVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int *piVar5;
  Function *pFVar6;
  Function *pFVar7;
  Function *pFVar8;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (Function *)((d_first.current)->className).d.d;
  pFVar1 = local_38.end.current + -n;
  pFVar8 = (Function *)((first.current)->className).d.d;
  local_38.intermediate.current = local_38.end.current;
  pFVar6 = pFVar1;
  pFVar7 = pFVar8;
  if (pFVar1 < pFVar8) {
    pFVar6 = pFVar8;
    pFVar7 = pFVar1;
  }
  while (local_38.intermediate.current != pFVar6) {
    pDVar2 = pFVar8[-1].className.d.d;
    pFVar8[-1].className.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].className.d.d = pDVar2;
    pcVar3 = pFVar8[-1].className.d.ptr;
    pFVar8[-1].className.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].className.d.ptr = pcVar3;
    qVar4 = pFVar8[-1].className.d.size;
    pFVar8[-1].className.d.size = 0;
    local_38.intermediate.current[-1].className.d.size = qVar4;
    pDVar2 = pFVar8[-1].functionName.d.d;
    pFVar8[-1].functionName.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].functionName.d.d = pDVar2;
    pcVar3 = pFVar8[-1].functionName.d.ptr;
    pFVar8[-1].functionName.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].functionName.d.ptr = pcVar3;
    qVar4 = pFVar8[-1].functionName.d.size;
    pFVar8[-1].functionName.d.size = 0;
    local_38.intermediate.current[-1].functionName.d.size = qVar4;
    pDVar2 = pFVar8[-1].functionParameters.d.d;
    pFVar8[-1].functionParameters.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].functionParameters.d.d = pDVar2;
    pcVar3 = pFVar8[-1].functionParameters.d.ptr;
    pFVar8[-1].functionParameters.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].functionParameters.d.ptr = pcVar3;
    qVar4 = pFVar8[-1].functionParameters.d.size;
    pFVar8[-1].functionParameters.d.size = 0;
    local_38.intermediate.current[-1].functionParameters.d.size = qVar4;
    ((d_first.current)->className).d.d =
         (Data *)&((d_first.current)->className).d.d[-5].super_QArrayData.alloc;
    pFVar8 = (Function *)&((first.current)->className).d.d[-5].super_QArrayData.alloc;
    ((first.current)->className).d.d = (Data *)pFVar8;
    local_38.intermediate.current = (Function *)((d_first.current)->className).d.d;
  }
  local_38.iter = &local_38.end;
  pFVar6 = local_38.intermediate.current;
  while (pFVar6 != pFVar1) {
    pDVar2 = pFVar6[-1].className.d.d;
    pFVar6[-1].className.d.d = pFVar8[-1].className.d.d;
    pFVar8[-1].className.d.d = pDVar2;
    pcVar3 = pFVar6[-1].className.d.ptr;
    pFVar6[-1].className.d.ptr = pFVar8[-1].className.d.ptr;
    pFVar8[-1].className.d.ptr = pcVar3;
    qVar4 = pFVar6[-1].className.d.size;
    pFVar6[-1].className.d.size = pFVar8[-1].className.d.size;
    pFVar8[-1].className.d.size = qVar4;
    pDVar2 = pFVar6[-1].functionName.d.d;
    pFVar6[-1].functionName.d.d = pFVar8[-1].functionName.d.d;
    pFVar8[-1].functionName.d.d = pDVar2;
    pcVar3 = pFVar6[-1].functionName.d.ptr;
    pFVar6[-1].functionName.d.ptr = pFVar8[-1].functionName.d.ptr;
    pFVar8[-1].functionName.d.ptr = pcVar3;
    qVar4 = pFVar6[-1].functionName.d.size;
    pFVar6[-1].functionName.d.size = pFVar8[-1].functionName.d.size;
    pFVar8[-1].functionName.d.size = qVar4;
    pDVar2 = pFVar6[-1].functionParameters.d.d;
    pFVar6[-1].functionParameters.d.d = pFVar8[-1].functionParameters.d.d;
    pFVar8[-1].functionParameters.d.d = pDVar2;
    pcVar3 = pFVar6[-1].functionParameters.d.ptr;
    pFVar6[-1].functionParameters.d.ptr = pFVar8[-1].functionParameters.d.ptr;
    pFVar8[-1].functionParameters.d.ptr = pcVar3;
    qVar4 = pFVar6[-1].functionParameters.d.size;
    pFVar6[-1].functionParameters.d.size = pFVar8[-1].functionParameters.d.size;
    pFVar8[-1].functionParameters.d.size = qVar4;
    ((d_first.current)->className).d.d =
         (Data *)&((d_first.current)->className).d.d[-5].super_QArrayData.alloc;
    pFVar8 = (Function *)&((first.current)->className).d.d[-5].super_QArrayData.alloc;
    ((first.current)->className).d.d = (Data *)pFVar8;
    pFVar6 = (Function *)((d_first.current)->className).d.d;
  }
  while (pFVar8 != pFVar7) {
    ((first.current)->className).d.d = (Data *)(pFVar8 + 1);
    pDVar2 = (pFVar8->functionParameters).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pFVar8->functionParameters).d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = (pFVar8->functionName).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pFVar8->functionName).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar5 = *(int **)&(pFVar8->className).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pFVar8->className).d.d,2,0x10);
      }
    }
    pFVar8 = (Function *)((first.current)->className).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<Function_*>,_long_long>::Destructor::
  ~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}